

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psarrst.c
# Opt level: O0

void cf2_arrstack_push(CF2_ArrStack arrstack,void *ptr)

{
  FT_Bool FVar1;
  void *newPtr;
  size_t offset;
  void *ptr_local;
  CF2_ArrStack arrstack_local;
  
  if ((arrstack->count != arrstack->allocated) ||
     (FVar1 = cf2_arrstack_setNumElements(arrstack,arrstack->allocated + arrstack->chunk),
     FVar1 != '\0')) {
    memcpy((void *)((long)arrstack->ptr + arrstack->count * arrstack->sizeItem),ptr,
           arrstack->sizeItem);
    arrstack->count = arrstack->count + 1;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_arrstack_push( CF2_ArrStack  arrstack,
                     const void*   ptr )
  {
    FT_ASSERT( arrstack );

    if ( arrstack->count == arrstack->allocated )
    {
      /* grow the buffer by one chunk */
      if ( !cf2_arrstack_setNumElements(
             arrstack, arrstack->allocated + arrstack->chunk ) )
      {
        /* on error, ignore the push */
        return;
      }
    }

    FT_ASSERT( ptr );

    {
      size_t  offset = arrstack->count * arrstack->sizeItem;
      void*   newPtr = (FT_Byte*)arrstack->ptr + offset;


      FT_MEM_COPY( newPtr, ptr, arrstack->sizeItem );
      arrstack->count += 1;
    }
  }